

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O0

QCborMap QCborMap::fromJsonObject(QJsonObject *obj)

{
  long lVar1;
  QExplicitlySharedDataPointer<QCborContainerPrivate> *in_RSI;
  QCborContainerPrivate *in_RDI;
  long in_FS_OFFSET;
  QCborMap *result;
  QExplicitlySharedDataPointer<QCborContainerPrivate> __obj;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  __obj.d.ptr = (totally_ordered_wrapper<QCborContainerPrivate_*>)
                (totally_ordered_wrapper<QCborContainerPrivate_*>)in_RDI;
  QCborMap((QCborMap *)0x48b434);
  QExplicitlySharedDataPointer<QCborContainerPrivate>::QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x48b44d);
  std::
  exchange<QExplicitlySharedDataPointer<QCborContainerPrivate>,QExplicitlySharedDataPointer<QCborContainerPrivate>>
            ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)__obj.d.ptr,
             (QExplicitlySharedDataPointer<QCborContainerPrivate> *)in_RDI);
  QExplicitlySharedDataPointer<QCborContainerPrivate>::operator=
            (in_RSI,(QExplicitlySharedDataPointer<QCborContainerPrivate> *)__obj.d.ptr);
  QExplicitlySharedDataPointer<QCborContainerPrivate>::~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)in_RDI);
  QExplicitlySharedDataPointer<QCborContainerPrivate>::~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)__obj.d.ptr;
}

Assistant:

QCborMap QCborMap::fromJsonObject(QJsonObject &&obj) noexcept
{
    QCborMap result;
    result.d = std::exchange(obj.o, {});
    return result;
}